

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O3

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob)

{
  float fVar1;
  int *piVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  void *pvVar14;
  size_t sVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  float *pfVar26;
  int iVar27;
  int k;
  uint uVar28;
  float *pfVar29;
  size_t sVar30;
  ulong __n;
  ulong uVar31;
  float fVar32;
  undefined1 auVar33 [16];
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_108;
  allocator_type local_f1;
  Mat local_f0;
  void *local_c0;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  float *local_a0;
  float *local_98;
  float *local_90;
  void *local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  float *local_68;
  void *local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar12 = bottom_blob->w;
  iVar5 = bottom_blob->h;
  uVar13 = bottom_blob->c;
  pvVar7 = (void *)(ulong)uVar13;
  sVar30 = (size_t)(int)uVar13;
  if (this->global_pooling != 0) {
    if (((top_blob->dims == 1) && (top_blob->w == uVar13)) && (top_blob->elemsize == 4)) {
      pvVar9 = top_blob->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      sVar30 = top_blob->cstep;
    }
    else {
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = 4;
      top_blob->dims = 1;
      top_blob->w = uVar13;
      top_blob->h = 1;
      top_blob->c = 1;
      top_blob->cstep = sVar30;
      if (uVar13 == 0) {
        return -100;
      }
      pvVar14 = malloc(sVar30 * 4 + 0x1c);
      pvVar9 = (void *)((long)pvVar14 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar9 - 8) = pvVar14;
      top_blob->data = pvVar9;
      piVar2 = (int *)((long)pvVar9 + sVar30 * 4);
      top_blob->refcount = piVar2;
      *piVar2 = 1;
    }
    if ((long)top_blob->c * sVar30 == 0) {
      return -100;
    }
    uVar28 = iVar5 * iVar12;
    if (this->pooling_type == 0) {
      if ((int)uVar13 < 1) {
        return 0;
      }
      lVar6 = bottom_blob->cstep * bottom_blob->elemsize;
      pvVar14 = bottom_blob->data;
      pvVar21 = (void *)0x0;
      pvVar20 = pvVar14;
      do {
        fVar32 = *(float *)((long)pvVar14 + lVar6 * (long)pvVar21);
        if (0 < (int)uVar28) {
          uVar23 = 0;
          do {
            fVar1 = *(float *)((long)pvVar20 + uVar23 * 4);
            if (fVar32 <= fVar1) {
              fVar32 = fVar1;
            }
            uVar23 = uVar23 + 1;
          } while (uVar28 != uVar23);
        }
        *(float *)((long)pvVar9 + (long)pvVar21 * 4) = fVar32;
        pvVar21 = (void *)((long)pvVar21 + 1);
        pvVar20 = (void *)((long)pvVar20 + lVar6);
      } while (pvVar21 != pvVar7);
    }
    else {
      if (this->pooling_type != 1) {
        return 0;
      }
      if ((int)uVar13 < 1) {
        return 0;
      }
      sVar30 = bottom_blob->cstep;
      sVar15 = bottom_blob->elemsize;
      pvVar14 = bottom_blob->data;
      pvVar20 = (void *)0x0;
      do {
        fVar32 = 0.0;
        if (0 < (int)uVar28) {
          uVar23 = 0;
          do {
            fVar32 = fVar32 + *(float *)((long)pvVar14 + uVar23 * 4);
            uVar23 = uVar23 + 1;
          } while (uVar28 != uVar23);
        }
        *(float *)((long)pvVar9 + (long)pvVar20 * 4) = fVar32 * (1.0 / (float)(int)uVar28);
        pvVar20 = (void *)((long)pvVar20 + 1);
        pvVar14 = (void *)((long)pvVar14 + sVar30 * sVar15);
      } while (pvVar20 != pvVar7);
    }
    return 0;
  }
  local_f0.data = bottom_blob->data;
  local_f0.refcount = bottom_blob->refcount;
  local_f0.elemsize = bottom_blob->elemsize;
  local_f0.dims = bottom_blob->dims;
  local_f0.c = uVar13;
  local_f0.h = iVar5;
  local_f0.w = iVar12;
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + 1;
    UNLOCK();
    local_f0.w = bottom_blob->w;
    local_f0.h = bottom_blob->h;
    local_f0.c = bottom_blob->c;
  }
  local_f0.cstep = bottom_blob->cstep;
  if (this->pooling_type == 0) {
    fVar32 = -3.4028235e+38;
  }
  else {
    fVar32 = 0.0;
  }
  iVar17 = this->pad_mode;
  if (iVar17 == 2) {
    iVar27 = 0;
    iVar17 = ~((iVar12 + -1) % this->stride_w) + this->kernel_w;
    iVar12 = ~((iVar5 + -1) % this->stride_h) + this->kernel_h;
    if ((0 < iVar17) || (0 < iVar12)) {
      copy_make_border(bottom_blob,&local_f0,iVar12 / 2,iVar12 - iVar12 / 2,iVar17 / 2,
                       iVar17 - iVar17 / 2,0,fVar32);
      goto LAB_00111386;
    }
    iVar25 = 0;
    iVar5 = local_f0.h;
    iVar12 = local_f0.w;
  }
  else if (iVar17 == 1) {
    copy_make_border(bottom_blob,&local_f0,this->pad_top,this->pad_bottom,this->pad_left,
                     this->pad_right,0,fVar32);
LAB_00111386:
    iVar27 = 0;
    iVar17 = -100;
    if ((local_f0.data == (void *)0x0) || ((long)local_f0.c * local_f0.cstep == 0))
    goto LAB_00111a50;
    iVar25 = 0;
    iVar5 = local_f0.h;
    iVar12 = local_f0.w;
  }
  else {
    iVar27 = 0;
    iVar25 = 0;
    if (iVar17 == 0) {
      iVar17 = ((iVar12 + this->pad_left + this->pad_right) - this->kernel_w) % this->stride_w;
      iVar12 = ((iVar5 + this->pad_top + this->pad_bottom) - this->kernel_h) % this->stride_h;
      iVar25 = this->stride_w - iVar17;
      if (iVar17 == 0) {
        iVar25 = 0;
      }
      iVar27 = this->stride_h - iVar12;
      if (iVar12 == 0) {
        iVar27 = 0;
      }
      copy_make_border(bottom_blob,&local_f0,this->pad_top,this->pad_bottom + iVar27,this->pad_left,
                       this->pad_right + iVar25,0,fVar32);
      iVar17 = -100;
      if ((local_f0.data == (void *)0x0) ||
         (iVar5 = local_f0.h, iVar12 = local_f0.w, (long)local_f0.c * local_f0.cstep == 0))
      goto LAB_00111a50;
    }
  }
  uVar23 = (long)(iVar12 - this->kernel_w) / (long)this->stride_w;
  local_b8 = uVar23 & 0xffffffff;
  uVar18 = (int)uVar23 + 1;
  uVar23 = (long)(iVar5 - this->kernel_h) / (long)this->stride_h;
  local_a8 = uVar23 & 0xffffffff;
  uVar28 = (int)uVar23 + 1;
  auVar33._0_4_ = -(uint)(top_blob->dims == 3);
  auVar33._4_4_ = -(uint)(uVar18 == top_blob->w);
  auVar33._8_4_ = -(uint)(uVar28 == top_blob->h);
  auVar33._12_4_ = -(uint)(uVar13 == top_blob->c);
  iVar5 = movmskps(3,auVar33);
  local_88 = pvVar7;
  if ((iVar5 == 0xf) && (top_blob->elemsize == 4)) {
    if (top_blob->data != (void *)0x0) {
      sVar15 = top_blob->cstep;
LAB_001114f9:
      uVar23 = (ulong)uVar18;
      if ((long)(int)uVar13 * sVar15 != 0) {
        __n = (long)this->kernel_h * (long)this->kernel_w;
        std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_f1);
        iVar5 = this->kernel_w;
        iVar17 = this->kernel_h;
        if (0 < iVar17) {
          iVar12 = iVar12 - iVar5;
          iVar8 = 0;
          iVar19 = 0;
          iVar22 = 0;
          do {
            if (0 < iVar5) {
              lVar6 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar22 + lVar6] = iVar19 + (int)lVar6;
                iVar5 = this->kernel_w;
                lVar6 = lVar6 + 1;
                iVar24 = (int)lVar6;
              } while (iVar24 < iVar5);
              iVar22 = iVar22 + iVar24;
              iVar17 = this->kernel_h;
              iVar19 = iVar19 + iVar24;
            }
            iVar19 = iVar19 + iVar12;
            iVar8 = iVar8 + 1;
          } while (iVar8 < iVar17);
        }
        iVar12 = (int)__n;
        if (this->pooling_type == 0) {
          if (0 < (int)local_88) {
            local_c0 = local_f0.data;
            local_90 = (float *)(local_f0.cstep * local_f0.elemsize);
            local_98 = (float *)CONCAT44(local_98._4_4_,local_f0.w);
            local_a0 = (float *)top_blob->data;
            local_b0 = top_blob->cstep * top_blob->elemsize;
            local_108 = (void *)0x0;
            do {
              if (-1 < (int)local_a8) {
                pfVar26 = (float *)(local_b0 * (long)local_108 + (long)local_a0);
                iVar5 = this->stride_h;
                iVar17 = this->stride_w;
                uVar10 = 0;
                do {
                  if (-1 < (int)local_b8) {
                    lVar6 = (long)(iVar5 * local_f0.w * (int)uVar10) * 4 +
                            (long)local_90 * (long)local_108;
                    uVar16 = 0;
                    do {
                      lVar11 = uVar16 * (long)iVar17;
                      fVar32 = *(float *)((long)local_f0.data + lVar11 * 4 + lVar6);
                      if (0 < iVar12) {
                        uVar31 = 0;
                        do {
                          fVar1 = *(float *)((long)local_f0.data +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar31] *
                                            4 + lVar11 * 4 + lVar6);
                          if (fVar32 <= fVar1) {
                            fVar32 = fVar1;
                          }
                          uVar31 = uVar31 + 1;
                        } while ((__n & 0xffffffff) != uVar31);
                      }
                      pfVar26[uVar16] = fVar32;
                      uVar16 = uVar16 + 1;
                    } while (uVar16 != uVar23);
                  }
                  pfVar26 = pfVar26 + (int)uVar18;
                  uVar10 = uVar10 + 1;
                } while (uVar10 != uVar28);
              }
              local_108 = (void *)((long)local_108 + 1);
            } while (local_108 != local_88);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)local_88)) {
          local_6c = -iVar27;
          lVar6 = (long)(int)uVar18;
          local_58 = local_f0.cstep * local_f0.elemsize;
          local_b0 = top_blob->cstep * top_blob->elemsize;
          local_70 = this->pad_bottom;
          iVar8 = this->pad_right;
          local_60 = local_f0.data;
          local_7c = local_f0.w;
          local_68 = (float *)top_blob->data;
          local_74 = this->pad_top;
          local_78 = this->pad_left;
          local_50 = lVar6 * 4;
          local_c0 = (void *)0x0;
          pfVar26 = local_68;
          pfVar3 = local_68 + top_blob->w * (int)local_a8;
          pfVar29 = local_68;
          pfVar4 = local_68 + (int)local_b8;
          do {
            local_98 = pfVar4;
            local_90 = pfVar3;
            local_a0 = pfVar26;
            if (-1 < (int)local_a8) {
              pfVar26 = (float *)(local_b0 * (long)local_c0 + (long)local_68);
              iVar19 = this->stride_h;
              iVar22 = this->stride_w;
              uVar10 = 0;
              do {
                if (-1 < (int)local_b8) {
                  uVar16 = 0;
                  do {
                    if (iVar12 < 1) {
                      fVar32 = 0.0;
                    }
                    else {
                      fVar32 = 0.0;
                      uVar31 = 0;
                      do {
                        fVar32 = fVar32 + *(float *)((long)local_f0.data +
                                                    (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar31] *
                                                  4 + uVar16 * (long)iVar22 * 4 +
                                                      (long)(iVar19 * local_f0.w * (int)uVar10) * 4
                                                      + local_58 * (long)local_c0);
                        uVar31 = uVar31 + 1;
                      } while ((__n & 0xffffffff) != uVar31);
                    }
                    pfVar26[uVar16] = fVar32 * (1.0 / (float)iVar12);
                    uVar16 = uVar16 + 1;
                  } while (uVar16 != uVar23);
                }
                pfVar26 = pfVar26 + lVar6;
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar28);
            }
            if ((local_74 != 0) && (-1 < (int)local_b8)) {
              uVar10 = 0;
              do {
                pfVar29[uVar10] =
                     pfVar29[uVar10] * (float)iVar17 * (1.0 / (float)(iVar17 - local_74));
                uVar10 = uVar10 + 1;
              } while (uVar23 != uVar10);
            }
            if ((local_70 != local_6c) && (-1 < (int)local_b8)) {
              uVar10 = 0;
              do {
                local_90[uVar10] =
                     local_90[uVar10] * (float)iVar17 *
                     (1.0 / (float)(iVar17 - (iVar27 + local_70)));
                uVar10 = uVar10 + 1;
              } while (uVar23 != uVar10);
            }
            if (local_78 == 0) {
LAB_001118a7:
              pfVar26 = local_98;
              uVar13 = uVar28;
              if (iVar8 != -iVar25 && -1 < (int)local_a8) {
                do {
                  *pfVar26 = *pfVar26 * (float)iVar5 * (1.0 / (float)(iVar5 - (iVar8 + iVar25)));
                  uVar13 = uVar13 - 1;
                  pfVar26 = pfVar26 + lVar6;
                } while (uVar13 != 0);
              }
            }
            else {
              pfVar26 = local_a0;
              uVar13 = uVar28;
              if (-1 < (int)local_a8) {
                do {
                  *pfVar26 = *pfVar26 * (float)iVar5 * (1.0 / (float)(iVar5 - local_78));
                  uVar13 = uVar13 - 1;
                  pfVar26 = pfVar26 + lVar6;
                } while (uVar13 != 0);
                goto LAB_001118a7;
              }
            }
            local_c0 = (void *)((long)local_c0 + 1);
            pfVar29 = (float *)((long)pfVar29 + local_b0);
            pfVar26 = (float *)((long)local_a0 + local_b0);
            pfVar3 = (float *)((long)local_90 + local_b0);
            pfVar4 = (float *)((long)local_98 + local_b0);
          } while (local_c0 != local_88);
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar17 = 0;
        goto LAB_00111a50;
      }
    }
  }
  else {
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = uVar18;
    top_blob->h = uVar28;
    top_blob->c = uVar13;
    sVar15 = (long)(int)(uVar28 * uVar18) + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = sVar15;
    lVar6 = sVar30 * sVar15;
    if (lVar6 != 0) {
      pvVar7 = malloc(lVar6 * 4 + 0x1c);
      pvVar9 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar9 - 8) = pvVar7;
      top_blob->data = pvVar9;
      piVar2 = (int *)((long)pvVar9 + lVar6 * 4);
      top_blob->refcount = piVar2;
      *piVar2 = 1;
      uVar13 = top_blob->c;
      goto LAB_001114f9;
    }
  }
  iVar17 = -100;
LAB_00111a50:
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if ((*local_f0.refcount == 0) && (local_f0.data != (void *)0x0)) {
      free(*(void **)((long)local_f0.data - 8));
    }
  }
  return iVar17;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            // fix pad
            if (pad_top != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_top);

                outptr = top_blob.channel(q).row(0);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_bottom + htailpad != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                outptr = top_blob.channel(q).row(outh - 1);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_left != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_left);

                outptr = top_blob.channel(q);
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
            if (pad_right + wtailpad != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                outptr = top_blob.channel(q);
                outptr += outw - 1;
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
        }
    }

    return 0;
}